

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O3

int event_callback_activate_later_nolock_(event_base *base,event_callback *evcb)

{
  event_callback **ppeVar1;
  unsigned_long uVar2;
  ushort uVar3;
  int iVar4;
  unsigned_long uVar5;
  
  uVar3 = evcb->evcb_flags;
  iVar4 = 0;
  if ((uVar3 & 0x28) == 0) {
    if ((base->th_base_lock != (void *)0x0) && (evthread_lock_debugging_enabled_ != 0)) {
      iVar4 = evthread_is_debug_lock_held_(base->th_base_lock);
      if (iVar4 == 0) {
        event_callback_activate_later_nolock__cold_2();
        goto LAB_002d0188;
      }
      uVar3 = evcb->evcb_flags;
    }
    if ((uVar3 & 0x28) == 0) {
      iVar4 = base->event_count + (uint)((uVar3 & 0x10) == 0);
      base->event_count = iVar4;
      if (iVar4 < base->event_count_max) {
        iVar4 = base->event_count_max;
      }
      base->event_count_max = iVar4;
      *(byte *)&evcb->evcb_flags = (byte)evcb->evcb_flags | 0x20;
      iVar4 = base->event_count_active + 1;
      base->event_count_active = iVar4;
      if (iVar4 < base->event_count_active_max) {
        iVar4 = base->event_count_active_max;
      }
      base->event_count_active_max = iVar4;
      if (base->nactivequeues <= (int)(uint)evcb->evcb_pri) {
LAB_002d0188:
        event_callback_activate_later_nolock__cold_1();
      }
      (evcb->evcb_active_next).tqe_next = (event_callback *)0x0;
      ppeVar1 = (base->active_later_queue).tqh_last;
      (evcb->evcb_active_next).tqe_prev = ppeVar1;
      *ppeVar1 = evcb;
      (base->active_later_queue).tqh_last = (event_callback **)evcb;
    }
    iVar4 = 1;
    if ((evthread_id_fn_ != (_func_unsigned_long *)0x0) && (base->running_loop != 0)) {
      uVar2 = base->th_owner_id;
      uVar5 = (*evthread_id_fn_)();
      if (uVar2 != uVar5) {
        evthread_notify_base(base);
      }
    }
  }
  return iVar4;
}

Assistant:

int
event_callback_activate_later_nolock_(struct event_base *base,
    struct event_callback *evcb)
{
	if (evcb->evcb_flags & (EVLIST_ACTIVE|EVLIST_ACTIVE_LATER))
		return 0;

	event_queue_insert_active_later(base, evcb);
	if (EVBASE_NEED_NOTIFY(base))
		evthread_notify_base(base);
	return 1;
}